

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  uint32_or_64_or_128_t<int> abs_value;
  uint uVar2;
  undefined8 in_RAX;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  ulong uVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>
                    (specs,(error_handler *)((long)&uStack_28 + 6));
  if (bVar1) {
    uStack_28 = CONCAT17(value,(undefined7)uStack_28);
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                   (out,specs,1,1,(anon_class_1_1_a8c68091 *)((long)&uStack_28 + 7));
  }
  else {
    uVar2 = (uint)value;
    if (value < '\0') {
      uVar2 = -uVar2;
      uVar4 = 0x100002d00000000;
    }
    else {
      uVar4 = (ulong)*(uint *)(&DAT_002690c0 + (*(ushort *)&specs->field_0x9 >> 2 & 0x1c)) << 0x20;
    }
    bVar3.container =
         (buffer<char> *)
         write_int_noinline<char,fmt::v8::appender,unsigned_int>
                   (out,(write_int_arg<unsigned_int>)(uVar2 | uVar4),specs,loc);
  }
  return (appender)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}